

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_shape::cform_read(cse_shape *this,xr_packet *packet)

{
  byte bVar1;
  reference value;
  shape_def *def;
  ulong local_20;
  uint_fast32_t n;
  xr_packet *packet_local;
  cse_shape *this_local;
  
  n = (uint_fast32_t)packet;
  packet_local = (xr_packet *)this;
  std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::clear(&this->m_shapes);
  bVar1 = xr_packet::r_u8((xr_packet *)n);
  local_20 = (ulong)bVar1;
  do {
    if (local_20 == 0) {
      return;
    }
    memset((void *)((long)&def + 4),0,0x44);
    std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::push_back
              (&this->m_shapes,(value_type *)((long)&def + 4));
    value = std::vector<xray_re::shape_def,_std::allocator<xray_re::shape_def>_>::back
                      (&this->m_shapes);
    xr_packet::r_u8((xr_packet *)n,&value->type);
    if (value->type == '\0') {
      xr_packet::r_vec3((xr_packet *)n,&(value->field_1).sphere.p);
      xr_packet::r_float((xr_packet *)n,&(value->field_1).sphere.r);
    }
    else {
      if (value->type != '\x01') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                      ,0x54,"void xray_re::cse_shape::cform_read(xr_packet &)");
      }
      xr_packet::r_matrix((xr_packet *)n,&(value->field_1).box);
    }
    local_20 = local_20 - 1;
  } while( true );
}

Assistant:

void cse_shape::cform_read(xr_packet& packet)
{
	m_shapes.clear();
	for (uint_fast32_t n = packet.r_u8(); n; --n) {
		m_shapes.push_back(shape_def());
		shape_def& def = m_shapes.back();
		packet.r_u8(def.type);
		if (def.type == SHAPE_SPHERE) {
			packet.r_vec3(def.sphere.p);
			packet.r_float(def.sphere.r);
		} else if (def.type == SHAPE_BOX) {
			packet.r_matrix(def.box);
		} else {
			xr_not_expected();
		}
	}
}